

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O1

_Bool borg_one_step_wearing_best(int skip)

{
  borg_best *pbVar1;
  borg_best *pbVar2;
  undefined1 uVar3;
  _Bool _Var4;
  uint16_t uVar5;
  uint uVar6;
  int16_t *piVar7;
  ulong uVar8;
  long lVar9;
  uint8_t *puVar10;
  int n;
  keycode_t k;
  char *what;
  bool bVar11;
  
LAB_0022fe35:
  n = 0;
  if (borg.goal.best_item != (borg_best *)0x0) {
    bVar11 = skip != 0;
    do {
      if (((borg.goal.best_item[n].tval == '\0') && (borg.goal.best_item[n].pval == 0)) &&
         (borg.goal.best_item[n].sval == '\0')) {
        uVar6 = 0;
        if ((int)(uint)z_info->equip_slots_max <= n + 1) {
          if (borg.goal.best_item != (borg_best *)0x0) {
            mem_free(borg.goal.best_item);
            borg.goal.best_item = (borg_best *)0x0;
          }
          uVar6 = 1;
          borg.goal.do_best = bVar11;
        }
        uVar3 = (*(code *)((long)&DAT_002884c0 + (long)(int)(&DAT_002884c0)[uVar6]))();
        return (_Bool)uVar3;
      }
      n = n + (uint)bVar11;
      switch(bVar11) {
      case false:
        goto switchD_0022fe88_caseD_0;
      }
    } while( true );
  }
  goto LAB_00230035;
switchD_0022fe88_caseD_0:
  uVar5 = borg_best_stuff_order(n);
  if (borg.goal.best_item[n].home == true) {
    if (borg_items[uVar5].iqty == '\0') {
      _Var4 = borg_inventory_full();
      if (!_Var4) {
        if ((ulong)z_info->store_inven_max == 0) goto LAB_00230027;
        puVar10 = &(borg_shops[7].ware)->iqty;
        uVar8 = 0;
        goto LAB_0022fffe;
      }
    }
    else {
      _Var4 = borg_home_full();
      if (!_Var4) {
        borg_keypress(100);
        k = 0x2f;
        goto LAB_0022ffa8;
      }
    }
  }
  else {
    if (borg_items[uVar5].iqty == '\0') {
      piVar7 = &borg_items->pval;
      lVar9 = 0;
      goto LAB_0022ff5a;
    }
    _Var4 = borg_inventory_full();
    if (!_Var4) {
      k = 0x74;
LAB_0022ffa8:
      borg_keypress(k);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         [(ulong)uVar5 - (ulong)z_info->pack_size]);
      goto LAB_0022ffc9;
    }
  }
  skip = skip + 1;
  goto LAB_0022fe35;
  while( true ) {
    lVar9 = lVar9 + 1;
    piVar7 = piVar7 + 0x1c4;
    if ((ulong)z_info->pack_size + 0xc == lVar9) break;
LAB_0022ff5a:
    if (((*piVar7 == borg.goal.best_item[n].pval) &&
        (*(uint8_t *)(piVar7 + -1) == borg.goal.best_item[n].tval)) &&
       (*(uint8_t *)((long)piVar7 + -1) == borg.goal.best_item[n].sval)) {
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar9]);
      pbVar2 = borg.goal.best_item;
      pbVar1 = borg.goal.best_item + n;
      pbVar1->home = false;
      pbVar1->tval = '\0';
      pbVar2[n].pval = 0;
      pbVar2[n].sval = '\0';
      goto LAB_0022ffc9;
    }
  }
  what = "unable to find item in inventory";
  goto LAB_0023002e;
  while( true ) {
    uVar8 = uVar8 + 1;
    puVar10 = puVar10 + 0x388;
    if (z_info->store_inven_max == uVar8) break;
LAB_0022fffe:
    if (((*(short *)(puVar10 + -2) == borg.goal.best_item[n].pval) &&
        (puVar10[-4] == borg.goal.best_item[n].tval)) &&
       (puVar10[-3] == borg.goal.best_item[n].sval)) {
      borg_keypress((int)SHOP_MENU_ITEMS[uVar8]);
      borg_keypress(0x70);
      if (1 < *puVar10) {
        borg_keypress(0x9c);
      }
      borg.goal.best_item[n].home = false;
LAB_0022ffc9:
      n = 1;
      goto LAB_00230035;
    }
  }
LAB_00230027:
  what = "unable to find item in home";
LAB_0023002e:
  borg_oops(what);
  n = 0;
LAB_00230035:
  return SUB41(n,0);
}

Assistant:

static bool borg_one_step_wearing_best(int skip)
{
    borg_item *item;
    int        item_num = 0;
    int        slot;
    int        i;

    if (!borg.goal.best_item)
        return false;

    /* find a change */
    while (true) {
        /* skip some if there are issues with full inventory */
        int skipping = skip;
        if (borg.goal.best_item[item_num].tval
            || borg.goal.best_item[item_num].pval
            || borg.goal.best_item[item_num].sval) {
            if (skipping) {
                item_num++;
                skipping--;
                continue;
            }

            break;
        }

        item_num++;
        if (item_num >= z_info->equip_slots_max) {
            borg_clear_best();

            /* If we aren't skipping we have done our best optimization.  */
            /* if we are skipping and got to the end, we probably need */
            /*  to start over */
            if (!skip) {
                borg.goal.do_best = false;
            }

            return false;
        }
    }

    /* Extract the slot */
    slot = borg_best_stuff_order(item_num);

    /* if the item is a home item to be worn, */
    /*  * drop any item you already have in the slot */
    /*  * if the slot is empty, pick up the item and mark */
    /*    as not in the home */
    /* if the item is not a home item to be worn, */
    /*      it is an inventory item.  */
    /*  * take off any item you already have in the slot */
    /*  * if the slot is empty, wear the item */
    /* NOTE that items need to be found again because they could have */
    /*   moved slots since other objects are being taken off and dropped */
    /*   into inventory and the home*/
    if (borg.goal.best_item[item_num].home) {
        /* if wearing an item in that slot, drop it */
        if (borg_items[slot].iqty) {

            /* if we can't drop an item into the home try the next change */
            if (borg_home_full())
                return borg_one_step_wearing_best(skip+1);


            borg_keypress('d');
            borg_keypress('/');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }

        /* if we can't get an item from the home, try the next change */
        if (borg_inventory_full())
            return borg_one_step_wearing_best(skip + 1);

        for (i = 0; i < z_info->store_inven_max; i++) {
            item = &borg_shops[BORG_HOME].ware[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;

            /* "Buy" the desired item from the home */
            borg_keypress(SHOP_MENU_ITEMS[i]);
            borg_keypress('p');
            if (item->iqty > 1)
                borg_keypress(KC_ENTER);


            borg.goal.best_item[item_num].home = false;
            return true;
        }
        borg_oops("unable to find item in home");
    } else {
        /* if wearing an item in that slot, take it off */
        if (borg_items[slot].iqty) {
            /* take off an item because there is no room, try next */
            if (borg_inventory_full())
                return borg_one_step_wearing_best(skip + 1);

            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }
        for (i = 0; i < INVEN_TOTAL; i++) {
            item = &borg_items[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);

            borg.goal.best_item[item_num].home = false;
            borg.goal.best_item[item_num].tval = 0;
            borg.goal.best_item[item_num].pval = 0;
            borg.goal.best_item[item_num].sval = 0;
            return true;
        }
        borg_oops("unable to find item in inventory");
    }

    return false;
}